

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

ArrayPtr<const_unsigned_char> * __thiscall
kj::Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_>::insert
          (Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_> *this,
          ArrayPtr<const_unsigned_char> *row)

{
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 row_00;
  uint skip;
  size_t pos;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar1;
  ArrayPtr<const_unsigned_char> *pAVar2;
  Maybe<unsigned_long> local_38;
  undefined1 local_28 [8];
  NullableValue<unsigned_long> existing;
  ArrayPtr<const_unsigned_char> *row_local;
  Table<kj::ArrayPtr<const_unsigned_char>,_kj::HashIndex<kj::_::HashSetCallbacks>_> *this_local;
  
  existing.field_1 = (anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2)row;
  pos = Vector<kj::ArrayPtr<const_unsigned_char>_>::size(&this->rows);
  row_00 = existing.field_1;
  skip = MaxValue_::operator_cast_to_unsigned_int((MaxValue_ *)&maxValue);
  Impl<0UL,_false>::insert
            ((Impl<0UL,_false> *)&local_38,this,pos,(ArrayPtr<const_unsigned_char> *)row_00,skip);
  other = _::readMaybe<unsigned_long>(&local_38);
  _::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_28,other);
  Maybe<unsigned_long>::~Maybe(&local_38);
  puVar1 = _::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_28);
  if (puVar1 != (unsigned_long *)0x0) {
    _::throwDuplicateTableRow();
  }
  pAVar2 = mv<kj::ArrayPtr<unsigned_char_const>>((ArrayPtr<const_unsigned_char> *)existing.field_1);
  pAVar2 = Vector<kj::ArrayPtr<unsigned_char_const>>::add<kj::ArrayPtr<unsigned_char_const>>
                     ((Vector<kj::ArrayPtr<unsigned_char_const>> *)this,pAVar2);
  _::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_28);
  return pAVar2;
}

Assistant:

Row& Table<Row, Indexes...>::insert(Row&& row) {
  KJ_IF_MAYBE(existing, Impl<>::insert(*this, rows.size(), row, kj::maxValue)) {
    _::throwDuplicateTableRow();
  } else {
    return rows.add(kj::mv(row));
  }